

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Detonation_PDU::Decode(Detonation_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  Descriptor *pDVar1;
  KUINT16 KVar2;
  AttachedPart *pAVar3;
  long lVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  byte bVar6;
  KUINT8 paramTyp;
  KString local_58;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
  *local_38;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar2 < 0x68) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Decode",(allocator<char> *)&paramTyp);
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  local_38 = (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
              *)&this->m_vVariableParameters;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::clear((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           *)local_38);
  Warfare_Header::Decode(&this->super_Warfare_Header,stream,ignoreHeader);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
  (*(this->m_LocationWorldCoords).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_LocationWorldCoords,stream);
  if ((this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion < 7) {
    if ((this->m_pDescriptor).m_pRef != (Descriptor *)0x0) goto LAB_00165e03;
    pAVar3 = (AttachedPart *)operator_new(0x20);
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)pAVar3);
    local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00217488;
    local_58._M_string_length = (size_type)pAVar3;
    local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
              (&this->m_pDescriptor,(KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_58);
  }
  else {
    bVar6 = (this->super_Warfare_Header).super_Header.super_Header6.field_0x25;
    pDVar1 = (this->m_pDescriptor).m_pRef;
    if ((bVar6 & 3) == 1) {
      if (pDVar1 != (Descriptor *)0x0) goto LAB_00165e03;
      pAVar3 = (AttachedPart *)operator_new(0x18);
      DATA_TYPE::Descriptor::Descriptor((Descriptor *)pAVar3);
    }
    else if ((bVar6 & 3) == 0) {
      if (pDVar1 != (Descriptor *)0x0) {
        lVar4 = __dynamic_cast(pDVar1,&DATA_TYPE::Descriptor::typeinfo,
                               &DATA_TYPE::MunitionDescriptor::typeinfo,0);
        if (lVar4 != 0) goto LAB_00165e03;
      }
      pAVar3 = (AttachedPart *)operator_new(0x20);
      DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)pAVar3);
    }
    else {
      if (pDVar1 != (Descriptor *)0x0) {
        lVar4 = __dynamic_cast(pDVar1,&DATA_TYPE::Descriptor::typeinfo,
                               &DATA_TYPE::ExplosionDescriptor::typeinfo,0);
        if (lVar4 != 0) goto LAB_00165e03;
      }
      pAVar3 = (AttachedPart *)operator_new(0x20);
      DATA_TYPE::ExplosionDescriptor::ExplosionDescriptor((ExplosionDescriptor *)pAVar3);
    }
    local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00217488;
    local_58._M_string_length = (size_type)pAVar3;
    local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
              (&this->m_pDescriptor,(KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_58);
  }
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr
            ((KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_58);
LAB_00165e03:
  pDVar1 = (this->m_pDescriptor).m_pRef;
  (*(pDVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pDVar1,stream);
  (*(this->m_LocationEntityCoords).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_LocationEntityCoords,stream);
  KDataStream::Read(stream,&this->m_ui8DetonationResult);
  KDataStream::Read(stream,&this->m_ui8NumOfVariableParams);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  for (bVar6 = 0; bVar6 < this->m_ui8NumOfVariableParams; bVar6 = bVar6 + 1) {
    KVar2 = KDataStream::GetCurrentWritePosition(stream);
    KDataStream::Read(stream,&paramTyp);
    KDataStream::SetCurrentWritePosition(stream,KVar2);
    pAVar3 = (AttachedPart *)
             DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                       ((uint)paramTyp,stream);
    if (pAVar3 == (AttachedPart *)0x0) {
      if (paramTyp == '\x01') {
        pAVar3 = (AttachedPart *)operator_new(0x30);
        DATA_TYPE::AttachedPart::AttachedPart(pAVar3,stream);
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00215700;
        local_58._M_string_length = (size_type)pAVar3;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  (local_38,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
      else if (paramTyp == '\0') {
        pAVar3 = (AttachedPart *)operator_new(0x28);
        DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pAVar3,stream);
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00215700;
        local_58._M_string_length = (size_type)pAVar3;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  (local_38,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
      else {
        pAVar3 = (AttachedPart *)operator_new(0x18);
        DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pAVar3,stream);
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00215700;
        local_58._M_string_length = (size_type)pAVar3;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  (local_38,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00215700;
      local_58._M_string_length = (size_type)pAVar3;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                (local_38,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
    }
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
  }
  return;
}

Assistant:

void Detonation_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DETONATION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Warfare_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_LocationWorldCoords;

    #if DIS_VERSION < 7

    if( !m_pDescriptor.GetPtr() )
    {
        m_pDescriptor = DescPtr( new MunitionDescriptor() );
    }

    #else

    // If the protocol version is not 7 then treat it as a MunitionDesc
    if( m_ui8ProtocolVersion < 7 )
    {
        if( !m_pDescriptor.GetPtr() )
        {
            m_pDescriptor = DescPtr( new MunitionDescriptor() );
        }
    }
    else // DIS 7
    {
        if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == MunitionDTI ) // Munition
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new MunitionDescriptor() );
            }
        }
        else if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == ExpendableDTI ) // Expendable
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExpendableDescriptor() );
            }
        }
        else // Explosion
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExplosionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExplosionDescriptor() );
            }
        }
    }
    #endif

    m_pDescriptor->Decode( stream );

    stream >> KDIS_STREAM m_LocationEntityCoords
           >> m_ui8DetonationResult
           >> m_ui8NumOfVariableParams
           >> m_ui16Padding1;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}